

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

ssize __thiscall Socket::recvFrom(Socket *this,byte *data,usize maxSize,uint32 *ip,uint16 *port)

{
  ssize sVar1;
  int *piVar2;
  socklen_t sinSize;
  sockaddr_in sin;
  socklen_t local_24;
  sockaddr local_20;
  
  local_24 = 0x10;
  sVar1 = recvfrom(this->s,data,(long)(int)maxSize,0,&local_20,&local_24);
  if (sVar1 == -1) {
    piVar2 = __errno_location();
    sVar1 = -1;
    if (*piVar2 == 0xb) {
      *piVar2 = 0;
    }
  }
  else {
    *ip = (uint)local_20.sa_data._2_4_ >> 0x18 | (local_20.sa_data._2_4_ & 0xff0000) >> 8 |
          (local_20.sa_data._2_4_ & 0xff00) << 8 | local_20.sa_data._2_4_ << 0x18;
    *port = local_20.sa_data._0_2_ << 8 | (ushort)local_20.sa_data._0_2_ >> 8;
  }
  return sVar1;
}

Assistant:

ssize Socket::recvFrom(byte* data, usize maxSize, uint32& ip, uint16& port)
{
  struct sockaddr_in sin;
  socklen_t sinSize = sizeof(sin);

  ssize r = ::recvfrom(s, (char*)data, (int)maxSize, 0, (sockaddr*)&sin, &sinSize);
  if(r == SOCKET_ERROR)
  {
    if(ERRNO == EWOULDBLOCK 
#ifndef _WIN32
      || ERRNO == EAGAIN
#endif
      )
    {
      SET_ERRNO(0);
    }
    return -1;
  }
  ip = ntohl(sin.sin_addr.s_addr);
  port = ntohs(sin.sin_port);
  return r;
}